

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

double __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
empirical_cost(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RDI;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double frac_inserts;
  double local_8;
  
  if (in_RDI->num_inserts_ + in_RDI->num_lookups_ == 0) {
    local_8 = 0.0;
  }
  else {
    iVar1 = in_RDI->num_inserts_;
    iVar2 = in_RDI->num_inserts_;
    iVar3 = in_RDI->num_lookups_;
    dVar4 = exp_search_iterations_per_operation(in_RDI);
    dVar5 = shifts_per_insert(in_RDI);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar4;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar5 * 0.5 * ((double)iVar1 / (double)(iVar2 + iVar3));
    auVar6 = vfmadd213sd_fma(ZEXT816(0x4034000000000000),auVar6,auVar7);
    local_8 = auVar6._0_8_;
  }
  return local_8;
}

Assistant:

double empirical_cost() const {
    if (num_inserts_ + num_lookups_ == 0) {
      return 0;
    }
    double frac_inserts =
        static_cast<double>(num_inserts_) / (num_inserts_ + num_lookups_);
    return kExpSearchIterationsWeight * exp_search_iterations_per_operation() +
           kShiftsWeight * shifts_per_insert() * frac_inserts;
  }